

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp-mpiu.c
# Opt level: O2

void MPIU_Segmenter_init(MPIU_Segmenter *segmenter,size_t *sizes,size_t *sizes2,size_t avgsegsize,
                        int Ngroup,MPI_Comm comm)

{
  int *piVar1;
  size_t *psVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  undefined4 in_register_00000084;
  int ThisTask;
  int NTask;
  undefined8 local_48;
  size_t *local_40;
  int rank;
  
  local_48 = CONCAT44(in_register_00000084,Ngroup);
  MPI_Comm_size(comm,&NTask);
  MPI_Comm_rank(comm,&ThisTask);
  local_40 = sizes;
  uVar3 = _MPIU_Segmenter_assign_colors(avgsegsize,sizes,sizes2,&segmenter->Nsegments,comm);
  piVar1 = &segmenter->ThisSegment;
  segmenter->ThisSegment = uVar3;
  iVar4 = (int)local_48;
  if ((int)uVar3 < 0) {
    uVar5 = (ulong)(iVar4 + 1);
    *piVar1 = NTask + 1;
  }
  else {
    uVar5 = ((long)iVar4 * (ulong)uVar3) / (ulong)(long)segmenter->Nsegments;
  }
  segmenter->GroupID = (int)uVar5;
  segmenter->Ngroup = iVar4;
  MPI_Comm_split(comm,uVar5,ThisTask,&segmenter->Group);
  MPI_Allreduce(piVar1,&segmenter->segment_start,1,&ompi_mpi_int,&ompi_mpi_op_min,segmenter->Group);
  MPI_Allreduce(piVar1,&segmenter->segment_end,1,&ompi_mpi_int,&ompi_mpi_op_max,segmenter->Group);
  segmenter->segment_end = segmenter->segment_end + 1;
  MPI_Comm_rank(segmenter->Group,&rank);
  psVar2 = local_40;
  iVar4 = MPIU_GetLoc(local_40 + ThisTask,(MPI_Datatype)&ompi_mpi_long,(MPI_Op)&ompi_mpi_op_max,
                      segmenter->Group);
  segmenter->group_leader_rank = iVar4;
  segmenter->is_group_leader = (uint)(rank == iVar4);
  MPI_Comm_split(comm,rank != iVar4,ThisTask,&segmenter->Leaders);
  MPI_Comm_split(segmenter->Group,segmenter->ThisSegment,ThisTask,&segmenter->Segment);
  iVar4 = MPIU_GetLoc(psVar2 + ThisTask,(MPI_Datatype)&ompi_mpi_long,(MPI_Op)&ompi_mpi_op_min,
                      segmenter->Segment);
  segmenter->segment_leader_rank = iVar4;
  return;
}

Assistant:

void
MPIU_Segmenter_init(MPIU_Segmenter * segmenter,
               size_t * sizes,
               size_t * sizes2,
               size_t avgsegsize,
               int Ngroup,
               MPI_Comm comm)
{
    int ThisTask, NTask;

    MPI_Comm_size(comm, &NTask);
    MPI_Comm_rank(comm, &ThisTask);

    segmenter->ThisSegment = _MPIU_Segmenter_assign_colors(avgsegsize, sizes, sizes2, &segmenter->Nsegments, comm);

    if(segmenter->ThisSegment >= 0) {
        /* assign segments to groups.
         * if Nsegments < Ngroup, some groups will have no segments, and thus no ranks belong to them. */
        segmenter->GroupID = ((size_t) segmenter->ThisSegment) * Ngroup / segmenter->Nsegments;
    } else {
        segmenter->GroupID = Ngroup + 1;
        segmenter->ThisSegment = NTask + 1;
    }

    segmenter->Ngroup = Ngroup;

    MPI_Comm_split(comm, segmenter->GroupID, ThisTask, &segmenter->Group);

    MPI_Allreduce(&segmenter->ThisSegment, &segmenter->segment_start, 1, MPI_INT, MPI_MIN, segmenter->Group);
    MPI_Allreduce(&segmenter->ThisSegment, &segmenter->segment_end, 1, MPI_INT, MPI_MAX, segmenter->Group);

    segmenter->segment_end ++;

    int rank;

    MPI_Comm_rank(segmenter->Group, &rank);

    /* rank with most data in a group is the leader of the group. */
    segmenter->group_leader_rank = MPIU_GetLoc(&sizes[ThisTask], MPI_LONG, MPI_MAX, segmenter->Group);

    segmenter->is_group_leader = rank == segmenter->group_leader_rank;

    MPI_Comm_split(comm, (rank == segmenter->group_leader_rank)? 0 : 1, ThisTask, &segmenter->Leaders);

    MPI_Comm_split(segmenter->Group, segmenter->ThisSegment, ThisTask, &segmenter->Segment);

    /* rank with least data in a segment is the leader of the segment. */
    segmenter->segment_leader_rank = MPIU_GetLoc(&sizes[ThisTask], MPI_LONG, MPI_MIN, segmenter->Segment);
}